

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_tools.cpp
# Opt level: O0

size_t JsonTools::size_of_item(string *s,size_t current,char start,char end)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  undefined8 local_38;
  size_t i;
  size_t en;
  size_t st;
  char end_local;
  char start_local;
  size_t current_local;
  string *s_local;
  
  en = 1;
  i = 0;
  local_38 = current + 1;
  while( true ) {
    bVar1 = false;
    if (en != i) {
      uVar2 = std::__cxx11::string::size();
      bVar1 = local_38 <= uVar2;
    }
    if (!bVar1) break;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
    if (*pcVar3 == start) {
      en = en + 1;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
    if (*pcVar3 == end) {
      i = i + 1;
    }
    local_38 = local_38 + 1;
  }
  return local_38 - current;
}

Assistant:

size_t JsonTools::size_of_item(const string& s, const size_t current, const char start, const char end){
	size_t st = 1, en = 0, i = current + 1;
	while (st != en && i <= s.size()){
		if (s[i] == start) ++st;
		if (s[i] == end) ++en;
		++i;
	}
	return i - current;
}